

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  CodedInputStream *in_RDI;
  bool result;
  Limit in_stack_ffffffffffffff8c;
  CodedInputStream *in_stack_ffffffffffffff90;
  
  bVar1 = ConsumedEntireMessage(in_RDI);
  PopLimit(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  in_RDI->recursion_budget_ = in_RDI->recursion_budget_ + 1;
  return bVar1;
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  GOOGLE_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}